

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[24],char_const*,char[15],char_const*,char[100]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [24],char **Args_1,
          char (*Args_2) [15],char **Args_3,char (*Args_4) [100])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [100];
  char **Args_local_3;
  char (*Args_local_2) [15];
  char **Args_local_1;
  char (*Args_local) [24];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[24],char_const*,char[15],char_const*,char[100]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [24])this,(char **)Args,(char (*) [15])Args_1,(char **)Args_2,
             (char (*) [100])Args_3);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}